

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void writeHorizontal(double **U,int sizeX,int sizeY,char *fileName)

{
  FILE *__stream;
  ulong uVar1;
  
  __stream = fopen(fileName,"w");
  fputc(0x5b,__stream);
  if (0 < sizeY) {
    uVar1 = 1;
    do {
      fprintf(__stream,"%g,",U[(long)(sizeX / 2) + 2][uVar1]);
      uVar1 = uVar1 + 1;
    } while (sizeY + 1 != uVar1);
  }
  fputc(0x5d,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writeHorizontal (REAL **U, int sizeX, int sizeY, char *fileName)
{
	FILE *out = fopen(fileName,"w");
	fprintf(out,"[");
	for (int j = 1; j <= sizeY; j++)
		fprintf(out,"%g,",U[2+sizeX/2][j]);
	fprintf(out,"]");
	fclose(out);
	return;
}